

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mod.c
# Opt level: O0

int BN_nnmod(BIGNUM *r,BIGNUM *m,BIGNUM *d,BN_CTX *ctx)

{
  int iVar1;
  code *pcVar2;
  int local_4;
  
  iVar1 = BN_div((BIGNUM *)0x0,(BIGNUM *)r,(BIGNUM *)m,(BIGNUM *)d,(BN_CTX *)ctx);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else if (r->neg == 0) {
    local_4 = 1;
  }
  else {
    pcVar2 = BN_add;
    if (d->neg != 0) {
      pcVar2 = BN_sub;
    }
    local_4 = (*pcVar2)(r,r,d);
  }
  return local_4;
}

Assistant:

int BN_nnmod(BIGNUM *r, const BIGNUM *m, const BIGNUM *d, BN_CTX *ctx)
{
    /*
     * like BN_mod, but returns non-negative remainder (i.e., 0 <= r < |d|
     * always holds)
     */

    if (!(BN_mod(r, m, d, ctx)))
        return 0;
    if (!r->neg)
        return 1;
    /* now   -|d| < r < 0,  so we have to set  r := r + |d| */
    return (d->neg ? BN_sub : BN_add) (r, r, d);
}